

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaValidator::checkTypesOK
          (SchemaValidator *this,SchemaElementDecl *derivedElemDecl,SchemaElementDecl *baseElemDecl,
          XMLCh *derivedElemName)

{
  ComplexTypeInfo *pCVar1;
  DatatypeValidator *pDVar2;
  int iVar3;
  RuntimeException *this_00;
  int *piVar4;
  ComplexTypeInfo *pCVar5;
  int *piVar6;
  
  pCVar1 = baseElemDecl->fComplexTypeInfo;
  piVar4 = &pCVar1->fContentType;
  if (pCVar1 == (ComplexTypeInfo *)0x0) {
    piVar4 = (int *)&(baseElemDecl->super_XMLElementDecl).field_0x2c;
  }
  if (*piVar4 != 1) {
    pCVar5 = derivedElemDecl->fComplexTypeInfo;
    piVar6 = &pCVar5->fContentType;
    if (pCVar5 == (ComplexTypeInfo *)0x0) {
      piVar6 = (int *)&(derivedElemDecl->super_XMLElementDecl).field_0x2c;
    }
    if (*piVar6 == 5) {
      if (*piVar4 != 5) {
        this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x67e,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        goto LAB_0030d3d8;
      }
      if (pCVar5 == (ComplexTypeInfo *)0x0) {
        if (((pCVar1 == (ComplexTypeInfo *)0x0) &&
            (pDVar2 = baseElemDecl->fDatatypeValidator, pDVar2 != (DatatypeValidator *)0x0)) &&
           (iVar3 = (*(pDVar2->super_XSerializable)._vptr_XSerializable[9])
                              (pDVar2,derivedElemDecl->fDatatypeValidator), (char)iVar3 != '\0')) {
          return;
        }
        this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x687,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        goto LAB_0030d3d8;
      }
    }
    if (pCVar5 != pCVar1) {
      for (; (pCVar5 != (ComplexTypeInfo *)0x0 && (pCVar5 != pCVar1));
          pCVar5 = pCVar5->fBaseComplexTypeInfo) {
        if (pCVar5->fDerivedBy != 4) goto LAB_0030d39e;
      }
      if (pCVar5 == (ComplexTypeInfo *)0x0) {
LAB_0030d39e:
        this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x69a,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
LAB_0030d3d8:
        __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
    }
  }
  return;
}

Assistant:

void
SchemaValidator::checkTypesOK(const SchemaElementDecl* const derivedElemDecl,
                              const SchemaElementDecl* const baseElemDecl,
                              const XMLCh* const derivedElemName) {

    SchemaElementDecl::ModelTypes baseType = baseElemDecl->getModelType();

    if (baseType == SchemaElementDecl::Any) {
        return;
    }

    ComplexTypeInfo* rInfo = derivedElemDecl->getComplexTypeInfo();
    ComplexTypeInfo* bInfo = baseElemDecl->getComplexTypeInfo();

    if (derivedElemDecl->getModelType() == SchemaElementDecl::Simple) {

        if (baseType != SchemaElementDecl::Simple) {
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
        }

        if (!rInfo) {

            DatatypeValidator* bDV = baseElemDecl->getDatatypeValidator();

            if (bInfo || bDV == 0 ||
				!bDV->isSubstitutableBy(derivedElemDecl->getDatatypeValidator())) {
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
            }

            return;
        }
    }

    if (rInfo == bInfo)
        return;

    for (; rInfo && rInfo != bInfo; rInfo = rInfo->getBaseComplexTypeInfo()) {
        if (rInfo->getDerivedBy() != SchemaSymbols::XSD_RESTRICTION) {

            rInfo = 0;
            break;
        }
    }

    if (!rInfo) {
        ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
    }
}